

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<LinkageUntangler>::init_holder
               (instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  byte *pbVar1;
  instance *piVar2;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) == 0) {
      return;
    }
    v_h->vh[1] = *v_h->vh;
  }
  else {
    v_h->vh[1] = (holder_ptr->_M_t).
                 super___uniq_ptr_impl<LinkageUntangler,_std::default_delete<LinkageUntangler>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_LinkageUntangler_*,_std::default_delete<LinkageUntangler>_>.
                 super__Head_base<0UL,_LinkageUntangler_*,_false>._M_head_impl;
    (holder_ptr->_M_t).
    super___uniq_ptr_impl<LinkageUntangler,_std::default_delete<LinkageUntangler>_>._M_t.
    super__Tuple_impl<0UL,_LinkageUntangler_*,_std::default_delete<LinkageUntangler>_>.
    super__Head_base<0UL,_LinkageUntangler_*,_false>._M_head_impl = (LinkageUntangler *)0x0;
  }
  piVar2 = v_h->inst;
  if ((piVar2->field_0x30 & 2) == 0) {
    pbVar1 = (piVar2->field_1).nonsimple.status + v_h->index;
    *pbVar1 = *pbVar1 | 1;
    return;
  }
  piVar2->field_0x30 = piVar2->field_0x30 | 4;
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }